

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O3

void __thiscall
obs::safe_list<obs::slot<void_(int,_int,_double)>_>::push_back
          (safe_list<obs::slot<void_(int,_int,_double)>_> *this,slot<void_(int,_int,_double)> *value
          )

{
  int iVar1;
  node *pnVar2;
  pthread_t pVar3;
  node **ppnVar4;
  bool bVar5;
  
  pnVar2 = (node *)operator_new(0x28);
  pnVar2->value = value;
  pnVar2->locks = 0;
  pnVar2->next = (node *)0x0;
  pVar3 = pthread_self();
  (pnVar2->creator_thread)._M_thread = pVar3;
  pnVar2->creator_thread_iterator = (iterator *)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    bVar5 = this->m_first != (node *)0x0;
    ppnVar4 = &this->m_last->next;
    if (!bVar5) {
      ppnVar4 = &this->m_last;
    }
    *ppnVar4 = pnVar2;
    (&this->m_first)[bVar5] = pnVar2;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void push_back(T* value) {
    node* n = new node(value);

    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!m_first)
      m_first = m_last = n;
    else {
      m_last->next = n;
      m_last = n;
    }
  }